

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::~IfcSpace(IfcSpace *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.field_0x58;
  *(undefined8 *)
   &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.field_0x58 = 0x8842b0
  ;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x40 = 0x8843a0;
  *(undefined8 *)
   &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.field_0xe0 = 0x8842d8
  ;
  this[-1].super_IfcSpatialStructureElement.super_IfcProduct.Representation.ptr.obj =
       (LazyObject *)0x884300;
  *(undefined8 *)&this[-1].super_IfcSpatialStructureElement.field_0x128 = 0x884328;
  *(undefined8 *)&this[-1].super_IfcSpatialStructureElement.field_0x158 = 0x884350;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0x884378;
  puVar1 = *(undefined1 **)
            &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcSpatialStructureElement::~IfcSpatialStructureElement
            ((IfcSpatialStructureElement *)this_00,&PTR_construction_vtable_24__008843b8);
  operator_delete(this_00,0x1b0);
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}